

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O3

float Amap_ManMaxDelay(Amap_Man_t *p)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  float fVar5;
  
  lVar1 = (long)p->vPos->nSize;
  if (lVar1 < 1) {
    fVar5 = 0.0;
  }
  else {
    fVar5 = 0.0;
    lVar2 = 0;
    do {
      uVar3 = *(uint *)((long)p->vPos->pArray[lVar2] + 0x14);
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      uVar3 = uVar3 >> 1;
      if (p->vObjs->nSize <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar4 = (int)*(float *)((long)p->vObjs->pArray[uVar3] + 0x50);
      if (iVar4 < (int)fVar5) {
        iVar4 = (int)fVar5;
      }
      fVar5 = (float)iVar4;
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  return fVar5;
}

Assistant:

float Amap_ManMaxDelay( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    float Delay = 0.0;
    int i;
    Amap_ManForEachPo( p, pObj, i )
        Delay = Abc_MaxInt( Delay, Amap_ObjFanin0(p,pObj)->Best.Delay );
    return Delay;
}